

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<float,int,float,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool,false,false>
               (float *ldata,int *rdata,float *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  int iVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar9 = 0;
      do {
        fVar12 = ldata[iVar9];
        iVar1 = rdata[iVar9];
        if (iVar1 < 0) {
          dVar4 = pow(10.0,(double)-(float)iVar1);
          dVar5 = round((double)fVar12 / dVar4);
          dVar5 = dVar5 * dVar4;
          fVar12 = 0.0;
        }
        else {
          dVar4 = pow(10.0,(double)iVar1);
          dVar5 = round((double)fVar12 * dVar4);
          dVar5 = dVar5 / dVar4;
        }
        if ((ulong)ABS(dVar5) < 0x7ff0000000000000) {
          fVar12 = (float)dVar5;
        }
        result_data[iVar9] = fVar12;
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar10 = 0;
    uVar7 = 0;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar11 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar11 = count;
        }
LAB_01be2e79:
        uVar8 = uVar7;
        if (uVar7 < uVar11) {
          do {
            fVar12 = ldata[uVar7];
            iVar1 = rdata[uVar7];
            if (iVar1 < 0) {
              dVar4 = pow(10.0,(double)-(float)iVar1);
              dVar5 = round((double)fVar12 / dVar4);
              dVar5 = dVar5 * dVar4;
              fVar12 = 0.0;
            }
            else {
              dVar4 = pow(10.0,(double)iVar1);
              dVar5 = round((double)fVar12 * dVar4);
              dVar5 = dVar5 / dVar4;
            }
            if ((ulong)ABS(dVar5) < 0x7ff0000000000000) {
              fVar12 = (float)dVar5;
            }
            result_data[uVar7] = fVar12;
            uVar7 = uVar7 + 1;
            uVar8 = uVar11;
          } while (uVar11 != uVar7);
        }
      }
      else {
        uVar3 = puVar2[uVar10];
        uVar11 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar11 = count;
        }
        uVar8 = uVar11;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_01be2e79;
          uVar8 = uVar7;
          if (uVar7 < uVar11) {
            uVar6 = 0;
            do {
              if ((uVar3 >> (uVar6 & 0x3f) & 1) != 0) {
                fVar12 = ldata[uVar7 + uVar6];
                iVar1 = rdata[uVar7 + uVar6];
                if (iVar1 < 0) {
                  dVar4 = pow(10.0,(double)-(float)iVar1);
                  dVar5 = round((double)fVar12 / dVar4);
                  dVar5 = dVar5 * dVar4;
                  fVar12 = 0.0;
                }
                else {
                  dVar4 = pow(10.0,(double)iVar1);
                  dVar5 = round((double)fVar12 * dVar4);
                  dVar5 = dVar5 / dVar4;
                }
                if ((ulong)ABS(dVar5) < 0x7ff0000000000000) {
                  fVar12 = (float)dVar5;
                }
                result_data[uVar7 + uVar6] = fVar12;
              }
              uVar6 = uVar6 + 1;
              uVar8 = uVar11;
            } while (uVar11 - uVar7 != uVar6);
          }
        }
      }
      uVar10 = uVar10 + 1;
      uVar7 = uVar8;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}